

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

int lj_cconv_tv_ct(CTState *cts,CType *s,CTypeID sid,TValue *o,uint8_t *sp)

{
  long lVar1;
  GCcdata *pGVar2;
  void *pvVar3;
  CTState *in_RCX;
  uint *in_RSI;
  long *in_RDI;
  int *in_R8;
  bool bVar4;
  CTSize sz;
  GCcdata *cd;
  uint32_t b;
  CTInfo sinfo;
  GCcdata *cd_1;
  CTypeID in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar5;
  int local_bc;
  undefined8 in_stack_ffffffffffffff68;
  uint8_t *in_stack_ffffffffffffff70;
  uint8_t *in_stack_ffffffffffffff78;
  CType *in_stack_ffffffffffffff80;
  CType *in_stack_ffffffffffffff88;
  CTState *in_stack_ffffffffffffff90;
  
  uVar5 = *in_RSI;
  if (uVar5 >> 0x1c == 0) {
    if ((uVar5 & 0xf8000000) == 0x8000000) {
      if (in_RSI[1] == 1) {
        bVar4 = (char)*in_R8 != '\0';
      }
      else {
        bVar4 = *in_R8 != 0;
      }
      *(uint *)((long)&in_RCX->tab + 4) = -2 - (uint)bVar4;
      *(uint *)(in_RDI[3] + 0xac) = -2 - (uint)bVar4;
    }
    else {
      if (((uVar5 & 0xfc000000) == 0) && (4 < in_RSI[1])) goto LAB_00132e7c;
      lj_cconv_ct_ct(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                     (CTInfo)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    }
    local_bc = 0;
  }
  else {
    if (((uVar5 & 0xfc000000) == 0x30000000) || (uVar5 >> 0x1c == 1)) {
      pGVar2 = lj_cdata_newref(in_RCX,(void *)in_RDI[2],in_stack_fffffffffffffeec);
      *(int *)&in_RCX->tab = (int)pGVar2;
      *(undefined4 *)((long)&in_RCX->tab + 4) = 0xfffffff5;
      return 1;
    }
LAB_00132e7c:
    uVar5 = in_RSI[1];
    lVar1 = *in_RDI;
    pvVar3 = lj_mem_newgco((lua_State *)CONCAT44(uVar5,in_stack_ffffffffffffff00),
                           (MSize)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    *(undefined1 *)((long)pvVar3 + 5) = 10;
    *(short *)((long)pvVar3 + 6) = (short)((long)in_RSI - lVar1 >> 4);
    *(int *)&in_RCX->tab = (int)pvVar3;
    *(undefined4 *)((long)&in_RCX->tab + 4) = 0xfffffff5;
    memcpy((void *)((long)pvVar3 + 8),in_R8,(ulong)uVar5);
    local_bc = 1;
  }
  return local_bc;
}

Assistant:

int lj_cconv_tv_ct(CTState *cts, CType *s, CTypeID sid,
		   TValue *o, uint8_t *sp)
{
  CTInfo sinfo = s->info;
  if (ctype_isnum(sinfo)) {
    if (!ctype_isbool(sinfo)) {
      if (ctype_isinteger(sinfo) && s->size > 4) goto copyval;
      if (LJ_DUALNUM && ctype_isinteger(sinfo)) {
	int32_t i;
	lj_cconv_ct_ct(cts, ctype_get(cts, CTID_INT32), s,
		       (uint8_t *)&i, sp, 0);
	if ((sinfo & CTF_UNSIGNED) && i < 0)
	  setnumV(o, (lua_Number)(uint32_t)i);
	else
	  setintV(o, i);
      } else {
	lj_cconv_ct_ct(cts, ctype_get(cts, CTID_DOUBLE), s,
		       (uint8_t *)&o->n, sp, 0);
	/* Numbers are NOT canonicalized here! Beware of uninitialized data. */
	lua_assert(tvisnum(o));
      }
    } else {
      uint32_t b = s->size == 1 ? (*sp != 0) : (*(int *)sp != 0);
      setboolV(o, b);
      setboolV(&cts->g->tmptv2, b);  /* Remember for trace recorder. */
    }
    return 0;
  } else if (ctype_isrefarray(sinfo) || ctype_isstruct(sinfo)) {
    /* Create reference. */
    setcdataV(cts->L, o, lj_cdata_newref(cts, sp, sid));
    return 1;  /* Need GC step. */
  } else {
    GCcdata *cd;
    CTSize sz;
  copyval:  /* Copy value. */
    sz = s->size;
    lua_assert(sz != CTSIZE_INVALID);
    /* Attributes are stripped, qualifiers are kept (but mostly ignored). */
    cd = lj_cdata_new(cts, ctype_typeid(cts, s), sz);
    setcdataV(cts->L, o, cd);
    memcpy(cdataptr(cd), sp, sz);
    return 1;  /* Need GC step. */
  }
}